

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O3

bool __thiscall
mp::SOLReader2<mp::NLW2_SOLHandler_C_Impl>::CheckReader<mp::SuffixReader<double>>
          (SOLReader2<mp::NLW2_SOLHandler_C_Impl> *this,SuffixReader<double> *rd,
          NLW2_SOLReadResultCode *rr)

{
  char *pcVar1;
  NLW2_SOLReadResultCode NVar2;
  uint *puVar3;
  
  NVar2 = (rd->super_SparseVecReader<double>).rr_;
  if (NVar2 == NLW2_SOLRead_Bad_Line) {
    serror(this,"Bad line in \'%s\': %s",this->stub_,
           (rd->super_SparseVecReader<double>).err_msg_._M_dataplus._M_p);
    this->readresult_ = NLW2_SOLRead_Bad_Line;
    NVar2 = NLW2_SOLRead_Bad_Line;
  }
  else if (NVar2 == NLW2_SOLRead_Early_EOF) {
    pcVar1 = this->stub_;
    puVar3 = (uint *)__errno_location();
    serror(this,"error reading \'%s\' (errno=%d)",pcVar1,(ulong)*puVar3);
    this->readresult_ = NLW2_SOLRead_Early_EOF;
    NVar2 = NLW2_SOLRead_Early_EOF;
  }
  else if ((rd->super_SparseVecReader<double>).n_ == 0) {
    if (NVar2 == NLW2_SOLRead_OK) {
      return true;
    }
    serror(this,(rd->super_SparseVecReader<double>).err_msg_._M_dataplus._M_p);
    ReportBadFormat(this);
    NVar2 = (rd->super_SparseVecReader<double>).rr_;
  }
  else {
    serror(this,"vector not read completely");
    NVar2 = ReportBadFormat(this);
  }
  *rr = NVar2;
  return false;
}

Assistant:

bool CheckReader(const Reader& rd, NLW2_SOLReadResultCode& rr) {
    if (NLW2_SOLRead_Early_EOF == rd.ReadResult())
      return (rr=ReportEarlyEof(), false);
    if (NLW2_SOLRead_Bad_Line == rd.ReadResult())
      return (rr=ReportBadLine(rd.ErrorMessage()), false);
    if (rd.Size()) {       // unfinished
      serror("vector not read completely");
      return (rr=ReportBadFormat(), false);
    }
    if (NLW2_SOLRead_OK != rd.ReadResult()) {
      serror( rd.ErrorMessage().c_str() );
      ReportBadFormat();
      return (rr=rd.ReadResult(), false);
    }
    return true;
  }